

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O1

bool __thiscall Character::DelTradeItem(Character *this,short item)

{
  list<Character_Item,_std::allocator<Character_Item>_> *plVar1;
  size_t *psVar2;
  _List_node_base *p_Var3;
  
  plVar1 = &this->trade_inventory;
  p_Var3 = (_List_node_base *)plVar1;
  do {
    p_Var3 = (((_List_base<Character_Item,_std::allocator<Character_Item>_> *)&p_Var3->_M_next)->
             _M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var3 == (_List_node_base *)plVar1) goto LAB_00117c96;
  } while (*(short *)&p_Var3[1]._M_next != item);
  psVar2 = &(this->trade_inventory).
            super__List_base<Character_Item,_std::allocator<Character_Item>_>._M_impl._M_node.
            _M_size;
  *psVar2 = *psVar2 - 1;
  std::__detail::_List_node_base::_M_unhook();
  operator_delete(p_Var3,0x18);
  CheckQuestRules(this);
LAB_00117c96:
  return p_Var3 != (_List_node_base *)plVar1;
}

Assistant:

bool Character::DelTradeItem(short item)
{
	for (std::list<Character_Item>::iterator it = this->trade_inventory.begin(); it != this->trade_inventory.end(); ++it)
	{
		if (it->id == item)
		{
			this->trade_inventory.erase(it);
			this->CheckQuestRules();
			return true;
		}
	}

	return false;
}